

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.h
# Opt level: O3

void __thiscall
slang::ast::CallExpression::visitExprsNoArgs<unused_sensitive_signal::MainVisitor&>
          (CallExpression *this,AlwaysFFVisitor *visitor)

{
  __index_type _Var1;
  Expression *pEVar2;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar3;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar4;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar5;
  
  pEVar2 = this->thisClass_;
  if (pEVar2 != (Expression *)0x0) {
    Expression::visitExpression<slang::ast::Expression_const,unused_sensitive_signal::MainVisitor&>
              (pEVar2,pEVar2,visitor);
  }
  if (*(__index_type *)
       ((long)&(this->subroutine).
               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
       + 0x30) == '\x01') {
    pvVar3 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       (&this->subroutine);
    _Var1 = *(__index_type *)
             ((long)&(pvVar3->extraInfo).
                     super__Variant_base<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Move_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
             + 0x18);
    if (_Var1 == '\x02') {
      pvVar5 = std::
               get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         (&pvVar3->extraInfo);
      if (pvVar5->inlineConstraints != (Constraint *)0x0) {
        Constraint::visit<unused_sensitive_signal::MainVisitor>(pvVar5->inlineConstraints,visitor);
        return;
      }
    }
    else if (_Var1 == '\x01') {
      pvVar4 = std::
               get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         (&pvVar3->extraInfo);
      pEVar2 = pvVar4->iterExpr;
      if (pEVar2 != (Expression *)0x0) {
        Expression::
        visitExpression<slang::ast::Expression_const,unused_sensitive_signal::MainVisitor&>
                  (pEVar2,pEVar2,visitor);
        return;
      }
    }
  }
  return;
}

Assistant:

void visitExprsNoArgs(TVisitor&& visitor) const {
        if (thisClass())
            thisClass()->visit(visitor);

        if (isSystemCall()) {
            auto& extra = std::get<1>(subroutine).extraInfo;
            if (extra.index() == 1) {
                if (auto iterExpr = std::get<1>(extra).iterExpr)
                    iterExpr->visit(visitor);
            }
            else if (extra.index() == 2) {
                if (auto constraints = std::get<2>(extra).inlineConstraints)
                    constraints->visit(visitor);
            }
        }
    }